

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.h
# Opt level: O1

void __thiscall
embree::CommandLineParser::
CommandLineOptionClosure<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/tutorials/common/tutorial/application.cpp:71:38)>
::parse(CommandLineOptionClosure<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_common_tutorial_application_cpp:71:38)>
        *this,Ref<embree::ParseStream> *cin,FileName *path)

{
  ParseStream *this_00;
  Application *pAVar1;
  long *plVar2;
  long *plVar3;
  long *local_58;
  long local_48;
  long lStack_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  this_00 = cin->ptr;
  if (this_00 != (ParseStream *)0x0) {
    (*(this_00->
      super_Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ).super_RefCount._vptr_RefCount[2])(this_00);
  }
  pAVar1 = (this->f).this;
  Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::get
            (&local_38,
             &this_00->
              super_Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            );
  plVar2 = (long *)std::__cxx11::string::replace((ulong)&local_38,0,(char *)0x0,0x253a54);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_48 = *plVar3;
    lStack_40 = plVar2[3];
    local_58 = &local_48;
  }
  else {
    local_48 = *plVar3;
    local_58 = (long *)*plVar2;
  }
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::__cxx11::string::_M_append((char *)&pAVar1->rtcore,(ulong)local_58);
  if (local_58 != &local_48) {
    operator_delete(local_58);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  (*(this_00->
    super_Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>).
    super_RefCount._vptr_RefCount[3])(this_00);
  return;
}

Assistant:

virtual void parse(Ref<ParseStream> cin, const FileName& path) {
        f(cin,path);
      }